

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

AWeapon * __thiscall APlayerPawn::BestWeapon(APlayerPawn *this,PClassAmmo *ammotype)

{
  byte bVar1;
  AWeapon *pAVar2;
  AAmmo *pAVar3;
  PClass *pPVar4;
  AInventory *pAVar5;
  PClass *pPVar6;
  PClassAmmo *pPVar7;
  AWeapon *this_00;
  int iVar8;
  AWeapon *pAVar9;
  bool bVar10;
  
  pAVar5 = AActor::FindInventory
                     (&this->super_AActor,
                      (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true);
  pAVar2 = (AWeapon *)(this->super_AActor).Inventory.field_0.p;
  if (pAVar2 == (AWeapon *)0x0) {
    pAVar9 = (AWeapon *)0x0;
  }
  else {
    if (((pAVar2->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20) ==
        0) {
      iVar8 = 0x7fffffff;
      pAVar9 = (AWeapon *)0x0;
      do {
        this_00 = pAVar2;
        pPVar4 = AWeapon::RegistrationInfo.MyClass;
        pPVar6 = *(PClass **)((long)&(this_00->super_AInventory).super_AActor.super_DThinker + 8);
        if (pPVar6 == (PClass *)0x0) {
          pPVar6 = (PClass *)
                   (*(code *)**(undefined8 **)
                               &(this_00->super_AInventory).super_AActor.super_DThinker)(this_00);
          *(PClass **)((long)&(this_00->super_AInventory).super_AActor.super_DThinker + 8) = pPVar6;
        }
        bVar10 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar4 && bVar10) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar10 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if ((bVar10) && (this_00->SelectionOrder <= iVar8)) {
          if (ammotype == (PClassAmmo *)0x0) {
LAB_0058296e:
            if (pAVar5 == (AInventory *)0x0) {
              bVar1 = (this_00->super_AInventory).field_0x4dd;
joined_r0x00582999:
              if ((bVar1 & 4) != 0) goto LAB_0058291c;
            }
            else {
              pAVar2 = (this_00->SisterWeapon).field_0.p;
              if (pAVar2 != (AWeapon *)0x0) {
                if ((*(byte *)((long)&pAVar2->super_AInventory + 0x20) & 0x20) == 0) {
                  bVar1 = *(undefined1 *)((long)&pAVar2->super_AInventory + 0x4dd);
                  goto joined_r0x00582999;
                }
                (this_00->SisterWeapon).field_0.p = (AWeapon *)0x0;
              }
            }
            if ((((this_00->super_AInventory).field_0x4dc & 0x20) != 0) ||
               (bVar10 = AWeapon::CheckAmmo(this_00,0,false,false,-1), bVar10)) {
              if (this_00->MinSelAmmo1 < 1) {
LAB_005829f9:
                if (this_00->MinSelAmmo2 < 1) {
LAB_00582a25:
                  iVar8 = this_00->SelectionOrder;
                  pAVar9 = this_00;
                }
                else {
                  pAVar3 = (this_00->Ammo2).field_0.p;
                  if (pAVar3 != (AAmmo *)0x0) {
                    if ((*(byte *)((long)&pAVar3->super_AInventory + 0x20) & 0x20) == 0) {
                      if (this_00->MinSelAmmo2 <= *(int *)((long)&pAVar3->super_AInventory + 0x4a8))
                      goto LAB_00582a25;
                    }
                    else {
                      (this_00->Ammo2).field_0.p = (AAmmo *)0x0;
                    }
                  }
                }
              }
              else {
                pAVar3 = (this_00->Ammo1).field_0.p;
                if (pAVar3 != (AAmmo *)0x0) {
                  if ((*(byte *)((long)&pAVar3->super_AInventory + 0x20) & 0x20) != 0)
                  goto LAB_00582a33;
                  if (this_00->MinSelAmmo1 <= *(int *)((long)&pAVar3->super_AInventory + 0x4a8))
                  goto LAB_005829f9;
                }
              }
            }
          }
          else {
            pAVar3 = (this_00->Ammo1).field_0.p;
            if (pAVar3 != (AAmmo *)0x0) {
              if ((*(byte *)((long)&pAVar3->super_AInventory + 0x20) & 0x20) == 0) {
                pPVar7 = *(PClassAmmo **)((long)&pAVar3->super_AInventory + 8);
                if (pPVar7 == (PClassAmmo *)0x0) {
                  pPVar7 = (PClassAmmo *)
                           (*(code *)**(undefined8 **)&pAVar3->super_AInventory)(pAVar3);
                  *(PClassAmmo **)((long)&pAVar3->super_AInventory + 8) = pPVar7;
                }
                if (pPVar7 == ammotype) goto LAB_0058296e;
              }
              else {
LAB_00582a33:
                (this_00->Ammo1).field_0.p = (AAmmo *)0x0;
              }
            }
          }
        }
LAB_0058291c:
        pAVar2 = (AWeapon *)(this_00->super_AInventory).super_AActor.Inventory.field_0.p;
        if (pAVar2 == (AWeapon *)0x0) {
          return pAVar9;
        }
      } while (((pAVar2->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags &
               0x20) == 0);
      pAVar5 = &this_00->super_AInventory;
    }
    else {
      pAVar5 = (AInventory *)&this->super_AActor;
      pAVar9 = (AWeapon *)0x0;
    }
    (pAVar5->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
  }
  return pAVar9;
}

Assistant:

AWeapon *APlayerPawn::BestWeapon(PClassAmmo *ammotype)
{
	AWeapon *bestMatch = NULL;
	int bestOrder = INT_MAX;
	AInventory *item;
	AWeapon *weap;
	bool tomed = NULL != FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true);

	// Find the best weapon the player has.
	for (item = Inventory; item != NULL; item = item->Inventory)
	{
		if (!item->IsKindOf (RUNTIME_CLASS(AWeapon)))
			continue;

		weap = static_cast<AWeapon *> (item);

		// Don't select it if it's worse than what was already found.
		if (weap->SelectionOrder > bestOrder)
			continue;

		// Don't select it if its primary fire doesn't use the desired ammo.
		if (ammotype != NULL &&
			(weap->Ammo1 == NULL ||
			 weap->Ammo1->GetClass() != ammotype))
			continue;

		// Don't select it if the Tome is active and this isn't the powered-up version.
		if (tomed && weap->SisterWeapon != NULL && weap->SisterWeapon->WeaponFlags & WIF_POWERED_UP)
			continue;

		// Don't select it if it's powered-up and the Tome is not active.
		if (!tomed && weap->WeaponFlags & WIF_POWERED_UP)
			continue;

		// Don't select it if there isn't enough ammo to use its primary fire.
		if (!(weap->WeaponFlags & WIF_AMMO_OPTIONAL) &&
			!weap->CheckAmmo (AWeapon::PrimaryFire, false))
			continue;

		// Don't select if if there isn't enough ammo as determined by the weapon's author.
		if (weap->MinSelAmmo1 > 0 && (weap->Ammo1 == NULL || weap->Ammo1->Amount < weap->MinSelAmmo1))
			continue;
		if (weap->MinSelAmmo2 > 0 && (weap->Ammo2 == NULL || weap->Ammo2->Amount < weap->MinSelAmmo2))
			continue;

		// This weapon is usable!
		bestOrder = weap->SelectionOrder;
		bestMatch = weap;
	}
	return bestMatch;
}